

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tensor.hpp
# Opt level: O1

void scp::_scp::cooleyTukey<std::complex<double>>
               (complex<double> *beg,uint64_t stride,complex<double> *base,uint64_t baseStride,
               uint64_t size,pair<unsigned_long,_unsigned_long> *factors,uint64_t factorCount)

{
  unsigned_long *puVar1;
  undefined8 *puVar2;
  double *pdVar3;
  uint64_t factorCount_00;
  double dVar4;
  size_type __n;
  undefined8 uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong size_00;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  complex<double> *pcVar12;
  uint64_t k;
  long lVar13;
  pair<unsigned_long,_unsigned_long> *factors_00;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  bool bVar20;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> tmp;
  vector<bool,_std::allocator<bool>_> visited;
  undefined1 local_a8 [24];
  complex<double> *local_90;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_88;
  long local_68;
  ulong local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  if (size != 1) {
    __n = factors->first;
    puVar1 = &factors->second;
    *puVar1 = *puVar1 - 1;
    local_60 = (ulong)(*puVar1 == 0);
    local_68 = (ulong)(*puVar1 == 0) << 4;
    size_00 = size / __n;
    local_88.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_88.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
    local_90 = base;
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_58,size,(bool *)&local_88,(allocator_type *)local_a8);
    *local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
     super__Bit_iterator_base._M_p =
         *local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p | 1;
    uVar9 = size - 1;
    uVar14 = size + 0x3e;
    if (-1 < (long)uVar9) {
      uVar14 = uVar9;
    }
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p
    [((long)uVar14 >> 6) + ((ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
         local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p
         [((long)uVar14 >> 6) + ((ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
         1L << ((byte)uVar9 & 0x3f);
    bVar20 = size == 0;
    if (!bVar20) {
      uVar14 = 0;
      do {
        uVar9 = uVar14 + 0x3f;
        if (-1 < (long)uVar14) {
          uVar9 = uVar14;
        }
        uVar10 = (ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001);
        uVar17 = 1L << ((byte)uVar14 & 0x3f);
        while ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p[((long)uVar9 >> 6) + (uVar10 - 1)] & uVar17)
               == 0) {
          local_88.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = *(pointer *)beg[uVar14 * stride]._M_value;
          local_88.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               *(pointer *)(beg[uVar14 * stride]._M_value + 8);
          local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[((long)uVar9 >> 6) + (uVar10 - 1)] =
               local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p[((long)uVar9 >> 6) + (uVar10 - 1)] | uVar17;
          uVar7 = (uVar14 % size_00) * __n + uVar14 / size_00;
          uVar8 = uVar14;
          while (uVar6 = uVar7, uVar6 != uVar14) {
            uVar5 = *(undefined8 *)(beg[uVar6 * stride]._M_value + 8);
            *(undefined8 *)beg[uVar8 * stride]._M_value =
                 *(undefined8 *)beg[uVar6 * stride]._M_value;
            *(undefined8 *)(beg[uVar8 * stride]._M_value + 8) = uVar5;
            uVar8 = uVar6 + 0x3f;
            if (-1 < (long)uVar6) {
              uVar8 = uVar6;
            }
            local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p
            [((long)uVar8 >> 6) + ((ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) - 1)]
                 = local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [((long)uVar8 >> 6) +
                    ((ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                   1L << ((byte)uVar6 & 0x3f);
            uVar8 = uVar6;
            uVar7 = (uVar6 % size_00) * __n + uVar6 / size_00;
          }
          *(pointer *)beg[uVar8 * stride]._M_value =
               local_88.
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
          *(pointer *)(beg[uVar8 * stride]._M_value + 8) =
               local_88.
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (bVar20) goto LAB_00108a58;
        }
        uVar14 = uVar14 + 1;
        bVar20 = uVar14 == size;
      } while (!bVar20);
    }
LAB_00108a58:
    factorCount_00 = factorCount - local_60;
    factors_00 = (pair<unsigned_long,_unsigned_long> *)((long)&factors->first + local_68);
    lVar15 = size_00 * stride;
    lVar18 = __n + (__n == 0);
    lVar11 = 0;
    lVar19 = lVar18;
    do {
      cooleyTukey<std::complex<double>>
                (beg + lVar15 * lVar11,stride,local_90,baseStride * __n,size_00,factors_00,
                 factorCount_00);
      lVar11 = lVar11 + 1;
      lVar19 = lVar19 + -1;
    } while (lVar19 != 0);
    factors_00[(ulong)(factors_00->first == __n) - 1].second =
         factors_00[(ulong)(factors_00->first == __n) - 1].second + 1;
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
              (&local_88,__n,(allocator_type *)local_a8);
    if (__n <= size) {
      uVar14 = 0;
      do {
        lVar11 = 0;
        lVar19 = lVar18;
        do {
          uVar5 = *(undefined8 *)(beg->_M_value + 8);
          puVar2 = (undefined8 *)
                   ((long)(local_88.
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar11);
          *puVar2 = *(undefined8 *)beg->_M_value;
          puVar2[1] = uVar5;
          beg = beg + lVar15;
          lVar11 = lVar11 + 0x10;
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
        pcVar12 = beg + -(__n * lVar15);
        lVar19 = 0;
        uVar9 = uVar14;
        do {
          *(undefined8 *)pcVar12->_M_value = 0;
          *(undefined8 *)(pcVar12->_M_value + 8) = 0;
          lVar16 = 0;
          lVar13 = 0;
          lVar11 = lVar18;
          do {
            pdVar3 = (double *)
                     ((long)(local_88.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar16);
            local_a8._0_8_ = *pdVar3;
            local_a8._8_8_ = pdVar3[1];
            std::complex<double>::operator*=
                      ((complex<double> *)local_a8,
                       local_90 + ((lVar13 * uVar9) % (size_00 * __n)) * ((baseStride * __n) / __n))
            ;
            dVar4 = *(double *)(pcVar12->_M_value + 8);
            *(double *)pcVar12->_M_value = (double)local_a8._0_8_ + *(double *)pcVar12->_M_value;
            *(double *)(pcVar12->_M_value + 8) = (double)local_a8._8_8_ + dVar4;
            lVar13 = lVar13 + 1;
            lVar16 = lVar16 + 0x10;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
          lVar19 = lVar19 + 1;
          pcVar12 = pcVar12 + lVar15;
          uVar9 = uVar9 + size_00;
        } while (lVar19 != lVar18);
        uVar14 = uVar14 + 1;
        beg = pcVar12 + (stride - __n * lVar15);
      } while (uVar14 < size_00);
    }
    if (local_88.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (ulong *)0x0) {
      operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
  }
  return;
}

Assistant:

constexpr void cooleyTukey(TValue* beg, uint64_t stride, const TValue* base, uint64_t baseStride, uint64_t size, std::pair<uint64_t, uint64_t>* factors, uint64_t factorCount)
		{
			if (size == 1)
			{
				return;
			}

			// TODO: https://en.wikipedia.org/wiki/Rader%27s_FFT_algorithm
			// if (factorCount == 1 && factors->second == 1)
			// {
			// }

			// Compute best radix and remove it from factors

			const uint64_t radix = factors->first;

			--factors->second;
			if (factors->second == 0)
			{
				++factors;
				--factorCount;
			}

			// Re-order elements according to radix

			const uint64_t subSize = size / radix;

			std::vector<bool> visited(size, false);
			visited[0] = true;
			visited[size - 1] = true;

			uint64_t n = 0;
			uint64_t preced, next;
			while (n != size)
			{
				if (visited[n])
				{
					++n;
					continue;
				}

				TValue tmp = *(beg + n * stride);
				visited[n] = true;

				preced = n;
				next = preced / subSize + (preced % subSize) * radix;

				while (next != n)
				{
					*(beg + preced * stride) = *(beg + next * stride);
					visited[next] = true;

					preced = next;
					next = preced / subSize + (preced % subSize) * radix;
				}

				*(beg + preced * stride) = tmp;
			}

			// Run algorithm on sub-ranges

			size = subSize;
			baseStride *= radix;

			for (uint64_t i = 0; i < radix; ++i)
			{
				cooleyTukey(beg + i * size * stride, stride, base, baseStride, size, factors, factorCount);
			}

			baseStride /= radix;
			const uint64_t realSize = size * radix;

			// Put back the factor

			if (factors->first != radix)
			{
				--factors;
				++factorCount;
			}
			++factors->second;

			// Merge sub-ranges

			const uint64_t rangeOffset = size * stride;
				
			std::vector<TValue> tmp(radix);
			TValue* it = beg;
			for (uint64_t i = 0; i < size; ++i, it += stride)
			{
				for (uint64_t j = 0; j < radix; ++j, it += rangeOffset)
				{
					tmp[j] = *it;
				}
				it -= radix * rangeOffset;

				uint64_t coeff = i;
				for (uint64_t j = 0; j < radix; ++j, it += rangeOffset, coeff += size)
				{
					*it = 0;
					for (uint64_t k = 0; k < radix; ++k)
					{
						*it += tmp[k] * *(base + ((k * coeff) % realSize) * baseStride);
					}
				}
				it -= radix * rangeOffset;
			}
		}